

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

string * __thiscall
TextBuffer::get_dot_graph_abi_cxx11_(string *__return_storage_ptr__,TextBuffer *this)

{
  Layer *pLVar1;
  string *psVar2;
  ostream *poVar3;
  long lVar4;
  pointer ppLVar5;
  Layer *layer;
  vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> layers;
  stringstream result;
  Layer *local_218;
  string *local_210;
  TextBuffer *local_208;
  pointer local_200;
  _Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_218 = this->top_layer;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208 = this;
  for (; local_218 != (Layer *)0x0; local_218 = local_218->previous_layer) {
    std::vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::push_back
              ((vector<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_> *)&local_1f8,
               &local_218);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"graph { label=\"--- buffer ---\" }\n");
  local_200 = local_1f8._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  local_210 = __return_storage_ptr__;
  for (ppLVar5 = local_1f8._M_impl.super__Vector_impl_data._M_finish; psVar2 = local_210,
      ppLVar5 != local_200; ppLVar5 = ppLVar5 + -1) {
    pLVar1 = ppLVar5[-1];
    poVar3 = std::operator<<(local_1a8,"graph { label=\"layer ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," (snapshot count ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    if (pLVar1 == local_208->base_layer) {
      std::operator<<(local_1a8,", base");
    }
    if (pLVar1->uses_patch == true) {
      std::operator<<(local_1a8,", uses_patch");
    }
    std::operator<<(local_1a8,"):\" }\n");
    if ((pLVar1->text).is_some == true) {
      poVar3 = std::operator<<(local_1a8,"graph { label=\"text:\n");
      poVar3 = operator<<(poVar3,&(pLVar1->text).value);
      std::operator<<(poVar3,"\" }\n");
    }
    if (0 < lVar4 >> 3) {
      Patch::get_dot_graph_abi_cxx11_(&local_1d8,&pLVar1->patch);
      std::operator<<(local_1a8,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    lVar4 = lVar4 + 8;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::_Vector_base<TextBuffer::Layer_*,_std::allocator<TextBuffer::Layer_*>_>::~_Vector_base
            (&local_1f8);
  return psVar2;
}

Assistant:

string TextBuffer::get_dot_graph() const {
  Layer *layer = top_layer;
  vector<Layer *> layers;
  while (layer) {
    layers.push_back(layer);
    layer = layer->previous_layer;
  }

  std::stringstream result;
  result << "graph { label=\"--- buffer ---\" }\n";
  for (auto begin = layers.rbegin(), iter = begin, end = layers.rend();
       iter != end; ++iter) {
    auto layer = *iter;
    auto index = iter - begin;
    result << "graph { label=\"layer " << index << " (snapshot count " << layer->snapshot_count;
    if (layer == base_layer) result << ", base";
    if (layer->uses_patch) result << ", uses_patch";
    result << "):\" }\n";
    if (layer->text) result << "graph { label=\"text:\n" << *layer->text << "\" }\n";
    if (index > 0) result << layer->patch.get_dot_graph();
  }
  return result.str();
}